

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_efficiency.cpp
# Opt level: O1

void run<shuff>(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *inputs)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  size_t input_size;
  int iVar9;
  ulong uVar10;
  char *__s;
  pointer pvVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 in_XMM2 [16];
  vector<double,_std::allocator<double>_> enc_speed;
  double decode_IPS;
  vector<double,_std::allocator<double>_> dec_speed;
  double encode_IPS;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  double **local_f8;
  iterator iStack_f0;
  double *local_e8 [3];
  double local_d0;
  void *local_c8;
  iterator iStack_c0;
  double *local_b8;
  double local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  uint32_t *local_88;
  long local_80;
  long local_78;
  pointer local_70;
  void *local_68 [2];
  long local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\\method{",8);
  local_e8[0] = (double *)CONCAT26(local_e8[0]._6_2_,0x6666756873);
  iStack_f0._M_current = (double *)0x5;
  local_f8 = local_e8;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_e8,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}  &",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_f8 != local_e8) {
    operator_delete(local_f8,(long)local_e8[0] + 1);
  }
  local_e8[0] = (double *)0x0;
  local_f8 = (double **)0x0;
  iStack_f0._M_current = (double *)0x0;
  local_b8 = (double *)0x0;
  local_c8 = (void *)0x0;
  iStack_c0._M_current = (double *)0x0;
  pvVar11 = (inputs->
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (inputs->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar11 != local_70) {
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_a0,
                 ((long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start) * 2,(allocator_type *)local_68);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
                 ((long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start) * 2,(allocator_type *)&local_88);
      uVar13 = 0xffffffffffffffff;
      iVar9 = 5;
      do {
        lVar6 = std::chrono::_V2::system_clock::now();
        puVar1 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        input_size = (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
        sVar7 = shuff_compress(local_a0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_a0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,puVar1,input_size);
        lVar8 = std::chrono::_V2::system_clock::now();
        if ((ulong)(lVar8 - lVar6) <= uVar13) {
          uVar13 = lVar8 - lVar6;
        }
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,uVar13);
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,(long)(pvVar11->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pvVar11->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_start >> 2);
      local_a8 = auVar3._0_8_ / (auVar2._0_8_ / 1000000000.0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_a0,sVar7);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
                 (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d0);
      iVar9 = 5;
      uVar13 = 0xffffffffffffffff;
      do {
        lVar6 = std::chrono::_V2::system_clock::now();
        shuff_decompress(local_88,local_80 - (long)local_88 >> 2,
                         local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,input_size);
        lVar8 = std::chrono::_V2::system_clock::now();
        uVar12 = lVar8 - lVar6;
        if (uVar13 < (ulong)(lVar8 - lVar6)) {
          uVar12 = uVar13;
        }
        iVar9 = iVar9 + -1;
        uVar13 = uVar12;
      } while (iVar9 != 0);
      puVar1 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,uVar12);
      sVar7 = (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,sVar7);
      local_d0 = auVar3._0_8_ / (auVar2._0_8_ / 1000000000.0);
      local_50.field_2._M_local_buf[4] = 'f';
      local_50.field_2._M_allocated_capacity._0_4_ = 0x66756873;
      local_50._M_string_length = 5;
      local_50.field_2._M_local_buf[5] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      REQUIRE_EQUAL(puVar1,local_88,sVar7,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT26(local_50.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_50.field_2._M_local_buf[5],
                                          CONCAT14(local_50.field_2._M_local_buf[4],
                                                   local_50.field_2._M_allocated_capacity._0_4_))) +
                        1);
      }
      if (iStack_f0._M_current == local_e8[0]) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_f8,iStack_f0,&local_a8);
      }
      else {
        *iStack_f0._M_current = local_a8;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
      if (iStack_c0._M_current == local_b8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_c8,iStack_c0,&local_d0);
      }
      else {
        *iStack_c0._M_current = local_d0;
        iStack_c0._M_current = iStack_c0._M_current + 1;
      }
      if (local_88 != (uint32_t *)0x0) {
        operator_delete(local_88,local_78 - (long)local_88);
      }
      if (local_68[0] != (void *)0x0) {
        operator_delete(local_68[0],local_58 - (long)local_68[0]);
      }
      if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar11 = pvVar11 + 1;
    } while (pvVar11 != local_70);
  }
  if ((double **)iStack_f0._M_current != local_f8) {
    uVar12 = 0;
    uVar13 = 0;
    do {
      uVar10 = uVar12;
      uVar4 = uVar13 & 0x3fffffffffffffff;
      while (uVar4 != 0) {
        putchar(0x20);
        uVar10 = uVar10 - 1;
        uVar4 = uVar10;
      }
      printf("%15.4f  &  %15.4f  ",((double *)local_f8)[uVar13],
             *(undefined8 *)((long)local_c8 + uVar13 * 8));
      uVar13 = uVar13 + 1;
      __s = "&";
      if (uVar13 == (long)iStack_f0._M_current - (long)local_f8 >> 3) {
        __s = "\\\\ \n";
      }
      puts(__s);
      uVar12 = uVar12 + 4;
    } while (uVar13 < (ulong)((long)iStack_f0._M_current - (long)local_f8 >> 3));
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_f8 != (double **)0x0) {
    operator_delete(local_f8,(long)local_e8[0] - (long)local_f8);
  }
  return;
}

Assistant:

void run(std::vector<std::vector<uint32_t>>& inputs)
{
    std::cout << "\\method{" << t_compressor::name() << "}  &" << std::endl;

    std::vector<double> enc_speed;
    std::vector<double> dec_speed;
    for (const auto& input : inputs) {
        // (1) encode
        std::vector<uint8_t> encoded_data(input.size() * 8);
        std::vector<uint8_t> tmp_buf(input.size() * 8);

        size_t encoded_bytes = 0;
        size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
        for (int i = 0; i < NUM_RUNS; i++) {
            auto start_encode = std::chrono::high_resolution_clock::now();
            encoded_bytes = t_compressor::encode(input.data(), input.size(),
                encoded_data.data(), encoded_data.size(), tmp_buf.data());
            auto stop_encode = std::chrono::high_resolution_clock::now();
            auto encoding_time_ns = stop_encode - start_encode;
            encoding_time_ns_min = std::min(
                (size_t)encoding_time_ns.count(), encoding_time_ns_min);
        }
        double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);

        // (2) decode
        encoded_data.resize(encoded_bytes);
        std::vector<uint32_t> recover(input.size());
        size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
        for (int i = 0; i < NUM_RUNS; i++) {
            auto start_decode = std::chrono::high_resolution_clock::now();
            t_compressor::decode(encoded_data.data(), encoded_data.size(),
                recover.data(), recover.size(), tmp_buf.data());
            auto stop_decode = std::chrono::high_resolution_clock::now();
            auto decode_time_ns = stop_decode - start_decode;
            decode_time_ns_min
                = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
        }
        double decode_IPS = compute_ips(input.size(), decode_time_ns_min);

        // (3) verify
        REQUIRE_EQUAL(
            input.data(), recover.data(), input.size(), t_compressor::name());

        enc_speed.push_back(encode_IPS);
        dec_speed.push_back(decode_IPS);
    }

    for (size_t i = 0; i < enc_speed.size(); i++) {
        for (size_t j = 0; j < i * 4; j++)
            printf(" ");
        printf("%15.4f  &  %15.4f  ", enc_speed[i], dec_speed[i]);
        if (i + 1 == enc_speed.size())
            printf("\\\\ \n\n");
        else
            printf("&\n");
    }
}